

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::ImageLayoutBindingCase::maxBindings(ImageLayoutBindingCase *this)

{
  Functions *pFVar1;
  GLint local_14;
  ImageLayoutBindingCase *pIStack_10;
  int units;
  ImageLayoutBindingCase *this_local;
  
  local_14 = 0;
  pIStack_10 = this;
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->getIntegerv)(0x8f38,&local_14);
  return local_14;
}

Assistant:

int maxBindings()
	{
		int units = 0;
		gl().getIntegerv(GL_MAX_IMAGE_UNITS, &units);
		return units;
	}